

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_sse2_128_32.c
# Opt level: O0

parasail_result_t *
parasail_sw_table_scan_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  parasail_matrix_t *ppVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  __m128i *b;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *ptr_00;
  __m128i *ptr_01;
  uint uVar8;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  __m128i *array;
  int32_t in_R9D;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  uint uVar11;
  __m128i c;
  __m128i vH_00;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i alVar12;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  int32_t in_stack_fffffffffffffa18;
  int local_5dc;
  int32_t temp;
  int32_t column_len;
  int32_t *t;
  __m128i vCompare;
  __m128i vFt;
  __m128i vW;
  __m128i *pvW;
  __m128i vHp;
  __m128i vH;
  __m128i vF;
  __m128i vHt;
  __m128i vE;
  __m128i vGapper;
  parasail_result_t *result;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vMaxHUnit;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  uint local_48c;
  int32_t score;
  __m128i vZero;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvGapper;
  __m128i *pvHMax;
  __m128i *pvH;
  __m128i *pvHt;
  __m128i *pvE;
  __m128i *pvP;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  size_t len;
  ulong uVar9;
  longlong lVar10;
  longlong extraout_RDX_01;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_sse2_128_32","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile32).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_sse2_128_32",
            "profile->profile32.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_sse2_128_32",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_scan_profile_sse2_128_32",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_sse2_128_32","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_scan_profile_sse2_128_32","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_scan_profile_sse2_128_32","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_scan_profile_sse2_128_32","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    matrix._4_4_ = 0;
    s1Len = profile->s1Len;
    ppVar1 = profile->matrix;
    iVar4 = (s1Len + 3) / 4;
    if (-open < ppVar1->min) {
      local_5dc = open + -0x80000000;
    }
    else {
      local_5dc = -0x80000000 - ppVar1->min;
    }
    uVar5 = local_5dc + 1;
    iVar6 = 0x7ffffffe - ppVar1->max;
    vNegInfFront[1] = CONCAT44(uVar5,uVar5);
    vMaxHUnit[0] = CONCAT44(uVar5,uVar5);
    vSaturationCheckMax[1] = CONCAT44(iVar6,iVar6);
    vSaturationCheckMin[0] = CONCAT44(iVar6,iVar6);
    _mm_insert_epi32_rpl((__m128i)ZEXT416(uVar5),(s1Len + 3) % 4,ppVar1->max);
    profile_local = (parasail_profile_t *)parasail_result_new_table1(iVar4 * 4,s2Len);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x4400404;
      uVar8 = *(uint *)&profile_local->field_0xc | 0x20000;
      len = (size_t)uVar8;
      *(uint *)&profile_local->field_0xc = uVar8;
      b = parasail_memalign___m128i(0x10,(long)iVar4);
      ptr = parasail_memalign___m128i(0x10,(long)iVar4);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar4);
      ptr_00 = parasail_memalign___m128i(0x10,(long)iVar4);
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar4);
      if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar12[0] = (long)iVar4;
        alVar12[1] = extraout_RDX;
        parasail_memset___m128i(b_00,alVar12,len);
        c[0] = (long)iVar4;
        c[1] = extraout_RDX_00;
        array = b;
        parasail_memset___m128i(b,c,len);
        vE[1]._0_4_ = -open;
        vE[1]._4_4_ = -open;
        vGapper[0]._0_4_ = -open;
        vGapper[0]._4_4_ = -open;
        end_query = iVar4;
        while (end_query = end_query + -1, -1 < end_query) {
          ptr_01[end_query][0] = CONCAT44(vE[1]._4_4_,(int)vE[1]);
          ptr_01[end_query][1] = CONCAT44(vGapper[0]._4_4_,(int)vGapper[0]);
          vE[1]._0_4_ = (int)vE[1] - gap;
          vE[1]._4_4_ = vE[1]._4_4_ - gap;
          vGapper[0]._0_4_ = (int)vGapper[0] - gap;
          vGapper[0]._4_4_ = vGapper[0]._4_4_ - gap;
        }
        vMaxHUnit[1] = vNegInfFront[1];
        vMaxH[0] = vMaxHUnit[0];
        vMaxH[1] = vNegInfFront[1];
        vSaturationCheckMax[0] = vMaxHUnit[0];
        local_48c = uVar5;
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          vH_00[0] = (ulong)end_ref;
          uVar9 = (ulong)(byte)s2[vH_00[0]];
          b_02[1] = (long)(ppVar1->mapper[uVar9] * iVar4);
          for (end_query = 0; b_04[1] = b_02[1] * 0x10, end_query < iVar4; end_query = end_query + 1
              ) {
            b_01[1] = (long)end_query * 0x10;
            a[1] = vH_00[0];
            a[0] = (longlong)array;
            b_01[0] = uVar9;
            alVar12 = _mm_max_epi32_rpl(a,b_01);
            b_02[0] = alVar12[1];
            b_02[1] = (long)end_query * 0x10;
            a_00[1] = vH_00[0];
            a_00[0] = (longlong)array;
            alVar12 = _mm_max_epi32_rpl(a_00,b_02);
            b_03[0] = alVar12[1];
            a_01[1] = vH_00[0];
            a_01[0] = (longlong)array;
            b_03[1] = b_02[1];
            alVar12 = _mm_max_epi32_rpl(a_01,b_03);
            uVar9 = alVar12[1];
            b[end_query][0] = extraout_XMM0_Qa;
            b[end_query][1] = extraout_XMM0_Qb;
            b_02[1] = (long)end_query;
            ptr[b_02[1]][0] = extraout_XMM0_Qa_00;
            ptr[b_02[1]][1] = extraout_XMM0_Qb_00;
          }
          a_02[1] = vH_00[0];
          a_02[0] = (longlong)array;
          b_04[0] = uVar9;
          alVar12 = _mm_max_epi32_rpl(a_02,b_04);
          lVar10 = alVar12[1];
          for (end_query = 0; end_query < 2; end_query = end_query + 1) {
            a_03[1] = vH_00[0];
            a_03[0] = (longlong)array;
            b_05[1]._0_4_ = 2;
            b_05[0] = lVar10;
            b_05[1]._4_4_ = 0;
            alVar12 = _mm_max_epi32_rpl(a_03,b_05);
            lVar10 = alVar12[1];
          }
          a_04[1] = vH_00[0];
          a_04[0] = (longlong)array;
          b_06[1]._0_4_ = 2;
          b_06[0] = lVar10;
          b_06[1]._4_4_ = 0;
          lVar10 = 2;
          alVar12 = _mm_max_epi32_rpl(a_04,b_06);
          b_07[0] = alVar12[1];
          a_05[1] = vH_00[0];
          a_05[0] = (longlong)array;
          b_07[1] = lVar10;
          alVar12 = _mm_max_epi32_rpl(a_05,b_07);
          lVar10 = alVar12[1];
          for (end_query = 0; end_query < iVar4; end_query = end_query + 1) {
            b_08[1] = (long)end_query * 0x10;
            a_06[1] = vH_00[0];
            a_06[0] = (longlong)array;
            b_08[0] = lVar10;
            alVar12 = _mm_max_epi32_rpl(a_06,b_08);
            b_09[0] = alVar12[1];
            a_07[1] = vH_00[0];
            a_07[0] = (longlong)array;
            b_09[1] = b_08[1];
            alVar12 = _mm_max_epi32_rpl(a_07,b_09);
            b_10[0] = alVar12[1];
            a_08[1] = vH_00[0];
            a_08[0] = (longlong)array;
            b_10[1] = b_08[1];
            alVar12 = _mm_max_epi32_rpl(a_08,b_10);
            b_11[0] = alVar12[1];
            b_11[1] = (long)end_query * 0x10;
            b_00[end_query][0] = extraout_XMM0_Qa_01;
            b_00[end_query][1] = extraout_XMM0_Qb_01;
            a_09[1] = vH_00[0];
            a_09[0] = (longlong)array;
            alVar12 = _mm_min_epi32_rpl(a_09,b_11);
            b_12[0] = alVar12[1];
            a_10[1] = vH_00[0];
            a_10[0] = (longlong)array;
            b_12[1] = b_11[1];
            _mm_max_epi32_rpl(a_10,b_12);
            array = (__m128i *)
                    ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                    rowcols->score_row;
            vH_00[0] = (ulong)(uint)end_query;
            uVar9 = (ulong)(uint)end_ref;
            vH_00[1]._0_4_ = iVar4;
            vH_00[1]._4_4_ = 0;
            arr_store_si128((int *)array,vH_00,end_ref,s2Len,in_R9D,in_stack_fffffffffffffa18);
            a_11[1] = vH_00[0];
            a_11[0] = (longlong)array;
            b_13[1] = uVar9;
            b_13[0] = extraout_RDX_01;
            alVar12 = _mm_max_epi32_rpl(a_11,b_13);
            lVar10 = alVar12[1];
            vMaxHUnit[1] = extraout_XMM0_Qa_04;
            vMaxH[0] = extraout_XMM0_Qb_04;
            vMaxH[1] = extraout_XMM0_Qa_03;
            vSaturationCheckMax[0] = extraout_XMM0_Qb_03;
            vSaturationCheckMax[1] = extraout_XMM0_Qa_02;
            vSaturationCheckMin[0] = extraout_XMM0_Qb_02;
          }
          local_158 = (int)vMaxHUnit[1];
          iStack_154 = (int)((ulong)vMaxHUnit[1] >> 0x20);
          iStack_150 = (int)vMaxH[0];
          iStack_14c = (int)((ulong)vMaxH[0] >> 0x20);
          local_168 = (int)vNegInfFront[1];
          iStack_164 = (int)((ulong)vNegInfFront[1] >> 0x20);
          iStack_160 = (int)vMaxHUnit[0];
          iStack_15c = (int)((ulong)vMaxHUnit[0] >> 0x20);
          uVar8 = -(uint)(iStack_160 < iStack_150);
          uVar11 = -(uint)(iStack_15c < iStack_14c);
          auVar3._4_4_ = -(uint)(iStack_164 < iStack_154);
          auVar3._0_4_ = -(uint)(local_168 < local_158);
          auVar3._12_4_ = uVar11;
          auVar3._8_4_ = uVar8;
          if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar3 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar3 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar3 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar3 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar8 & 0x80) != 0) || (uVar8 & 0x8000) != 0) || (uVar8 & 0x800000) != 0) ||
                 uVar8 != 0) || (uVar11 >> 7 & 1) != 0) || (uVar11 >> 0xf & 1) != 0) ||
              (uVar11 >> 0x17 & 1) != 0) || iStack_15c < iStack_14c) {
            a_12[1] = vH_00[0];
            a_12[0] = (longlong)array;
            local_48c = _mm_hmax_epi32_rpl(a_12);
            vNegInfFront[1] = CONCAT44(local_48c,local_48c);
            vMaxHUnit[0] = CONCAT44(local_48c,local_48c);
            matrix._4_4_ = end_ref;
            array = ptr_00;
            memcpy(ptr_00,b_00,(long)iVar4 << 4);
          }
        }
        _temp = ptr_00;
        for (end_query = 0; end_query < iVar4 * 4; end_query = end_query + 1) {
          if (((uint)(*_temp)[0] == local_48c) &&
             (iVar7 = end_query / 4 + (end_query % 4) * iVar4, iVar7 < s1Len)) {
            s1Len = iVar7;
          }
          _temp = (__m128i *)((long)*_temp + 4);
        }
        local_e8 = (int)vSaturationCheckMax[1];
        iStack_e4 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_e0 = (int)vSaturationCheckMin[0];
        iStack_dc = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_178 = (int)vMaxH[1];
        iStack_174 = (int)((ulong)vMaxH[1] >> 0x20);
        iStack_170 = (int)vSaturationCheckMax[0];
        iStack_16c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar9 = CONCAT44(-(uint)(iStack_dc < (int)uVar5),-(uint)(iStack_e0 < (int)uVar5)) |
                CONCAT44(-(uint)(iVar6 < iStack_16c),-(uint)(iVar6 < iStack_170));
        auVar2._8_8_ = uVar9;
        auVar2._0_8_ = CONCAT44(-(uint)(iStack_e4 < (int)uVar5),-(uint)(local_e8 < (int)uVar5)) |
                       CONCAT44(-(uint)(iVar6 < iStack_174),-(uint)(iVar6 < local_178));
        if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar9 >> 7 & 1) != 0) || (uVar9 >> 0xf & 1) != 0) || (uVar9 >> 0x17 & 1) != 0) ||
               (uVar9 >> 0x1f & 1) != 0) || (uVar9 >> 0x27 & 1) != 0) || (uVar9 >> 0x2f & 1) != 0)
            || (uVar9 >> 0x37 & 1) != 0) || (long)uVar9 < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          local_48c = 0;
          s1Len = 0;
          matrix._4_4_ = 0;
        }
        *(uint *)&profile_local->s1 = local_48c;
        *(int32_t *)((long)&profile_local->s1 + 4) = s1Len;
        profile_local->s1Len = matrix._4_4_;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(b_00);
        parasail_free(ptr);
        parasail_free(b);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32_rpl(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vF = _mm_max_epi32_rpl(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32_rpl(vHt, vF);
        vH = _mm_max_epi32_rpl(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32_rpl(vHt, vF);
            vH = _mm_max_epi32_rpl(vH, vZero);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int32_t *t = (int32_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}